

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O1

ptrdiff_t CLI::detail::find_member
                    (string *name,
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *names,bool ignore_case,bool ignore_underscore)

{
  pointer pcVar1;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var2;
  ptrdiff_t pVar3;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var4;
  undefined7 in_register_00000011;
  undefined1 local_d1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d0;
  size_type local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  long local_88;
  char local_80;
  undefined7 uStack_7f;
  undefined8 uStack_78;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  long local_68;
  uint local_60;
  undefined4 uStack_5c;
  undefined4 uStack_58;
  undefined4 uStack_54;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  if ((int)CONCAT71(in_register_00000011,ignore_case) == 0) {
    if (ignore_underscore) {
      pcVar1 = (name->_M_dataplus)._M_p;
      local_90._M_current = &local_80;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,pcVar1,pcVar1 + name->_M_string_length);
      local_d1 = 0x5f;
      _Var4 = ::std::
              __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                        (local_90,local_90._M_current + local_88,
                         (_Iter_equals_val<const_char>)&local_d1);
      local_b0._M_string_length = (long)_Var4._M_current - (long)local_90._M_current;
      *_Var4._M_current = '\0';
      if (local_90._M_current == &local_80) {
        local_b0.field_2._8_8_ = uStack_78;
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      }
      else {
        local_b0._M_dataplus._M_p = local_90._M_current;
      }
      local_b0.field_2._M_allocated_capacity._1_7_ = uStack_7f;
      local_b0.field_2._M_local_buf[0] = local_80;
      local_88 = 0;
      local_80 = '\0';
      local_90._M_current = &local_80;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (name,&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if (local_90._M_current != &local_80) {
        operator_delete(local_90._M_current,CONCAT71(uStack_7f,local_80) + 1);
      }
      _Var2 = ::std::
              __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::find_member(std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,bool,bool)::_lambda(std::__cxx11::string)_3_>>
                        ((names->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start,
                         (names->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish,name);
    }
    else {
      _Var2 = ::std::
              __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                        ((names->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start,
                         (names->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish,name);
    }
  }
  else if (ignore_underscore) {
    pcVar1 = (name->_M_dataplus)._M_p;
    local_70._M_current = (char *)&local_60;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar1,pcVar1 + name->_M_string_length);
    local_d1 = 0x5f;
    _Var4 = ::std::
            __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                      (local_70,local_70._M_current + local_68,
                       (_Iter_equals_val<const_char>)&local_d1);
    local_c8 = (long)_Var4._M_current - (long)local_70._M_current;
    *_Var4._M_current = '\0';
    if ((uint *)local_70._M_current == &local_60) {
      local_c0._8_4_ = uStack_58;
      local_c0._12_4_ = uStack_54;
      local_d0 = &local_c0;
    }
    else {
      local_d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_70._M_current;
    }
    local_c0._M_allocated_capacity._4_4_ = uStack_5c;
    local_c0._M_allocated_capacity._0_4_ = local_60;
    local_68 = 0;
    local_60 = local_60 & 0xffffff00;
    local_70._M_current = (char *)&local_60;
    ::std::
    transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,CLI::detail::to_lower(std::__cxx11::string)::_lambda(char_const&)_1_>
              (local_d0,local_d0->_M_local_buf + local_c8,local_d0);
    if (local_d0 == &local_c0) {
      local_b0.field_2._8_8_ = CONCAT44(local_c0._12_4_,local_c0._8_4_);
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    }
    else {
      local_b0._M_dataplus._M_p = (pointer)local_d0;
    }
    local_b0.field_2._M_allocated_capacity = local_c0._M_allocated_capacity;
    local_b0._M_string_length = local_c8;
    local_c8 = 0;
    local_c0._M_allocated_capacity = local_c0._M_allocated_capacity & 0xffffffffffffff00;
    local_d0 = &local_c0;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (name,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if (local_d0 != &local_c0) {
      operator_delete(local_d0,local_c0._M_allocated_capacity + 1);
    }
    if ((uint *)local_70._M_current != &local_60) {
      operator_delete(local_70._M_current,CONCAT44(uStack_5c,local_60) + 1);
    }
    _Var2 = ::std::
            __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::find_member(std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,bool,bool)::_lambda(std::__cxx11::string)_1_>>
                      ((names->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start,
                       (names->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish,name);
  }
  else {
    pcVar1 = (name->_M_dataplus)._M_p;
    local_50 = &local_40;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar1,pcVar1 + name->_M_string_length);
    ::std::
    transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,CLI::detail::to_lower(std::__cxx11::string)::_lambda(char_const&)_1_>
              (local_50,local_50->_M_local_buf + local_48,local_50);
    if (local_50 == &local_40) {
      local_b0.field_2._8_8_ = local_40._8_8_;
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    }
    else {
      local_b0._M_dataplus._M_p = (pointer)local_50;
    }
    local_b0.field_2._M_allocated_capacity._1_7_ = local_40._M_allocated_capacity._1_7_;
    local_b0.field_2._M_local_buf[0] = local_40._M_local_buf[0];
    local_b0._M_string_length = local_48;
    local_48 = 0;
    local_40._M_local_buf[0] = '\0';
    local_50 = &local_40;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (name,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(local_40._M_allocated_capacity._1_7_,
                                        local_40._M_local_buf[0]) + 1);
    }
    _Var2 = ::std::
            __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::find_member(std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,bool,bool)::_lambda(std::__cxx11::string)_2_>>
                      ((names->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start,
                       (names->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish,name);
  }
  if (_Var2._M_current ==
      (names->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    pVar3 = -1;
  }
  else {
    pVar3 = (long)_Var2._M_current -
            (long)(names->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start >> 5;
  }
  return pVar3;
}

Assistant:

inline std::ptrdiff_t find_member(std::string name,
                                  const std::vector<std::string> names,
                                  bool ignore_case = false,
                                  bool ignore_underscore = false) {
    auto it = std::end(names);
    if(ignore_case) {
        if(ignore_underscore) {
            name = detail::to_lower(detail::remove_underscore(name));
            it = std::find_if(std::begin(names), std::end(names), [&name](std::string local_name) {
                return detail::to_lower(detail::remove_underscore(local_name)) == name;
            });
        } else {
            name = detail::to_lower(name);
            it = std::find_if(std::begin(names), std::end(names), [&name](std::string local_name) {
                return detail::to_lower(local_name) == name;
            });
        }

    } else if(ignore_underscore) {
        name = detail::remove_underscore(name);
        it = std::find_if(std::begin(names), std::end(names), [&name](std::string local_name) {
            return detail::remove_underscore(local_name) == name;
        });
    } else {
        it = std::find(std::begin(names), std::end(names), name);
    }

    return (it != std::end(names)) ? (it - std::begin(names)) : (-1);
}